

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O1

void __thiscall Assimp::ObjFileParser::getComment(ObjFileParser *this)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  
  pbVar3 = (byte *)(this->m_DataIt)._M_current;
  pbVar1 = (byte *)(this->m_DataItEnd)._M_current;
  if (pbVar1 + -1 != pbVar3 && pbVar3 != pbVar1) {
    do {
      if (((*pbVar3 < 0xe) && ((0x3401U >> (*pbVar3 & 0x1f) & 1) != 0)) ||
         (pbVar3 = pbVar3 + 1, pbVar3 == pbVar1)) break;
    } while (pbVar3 != pbVar1 + -1);
  }
  pbVar2 = pbVar3;
  if (pbVar3 != pbVar1) {
    pbVar3 = pbVar3 + 1;
    this->m_uiLine = this->m_uiLine + 1;
    pbVar2 = pbVar3;
  }
  for (; (pbVar2 != pbVar1 && ((*pbVar2 == 0x20 || (pbVar3 = pbVar2, *pbVar2 == 9))));
      pbVar2 = pbVar2 + 1) {
    pbVar3 = pbVar1;
  }
  (this->m_DataIt)._M_current = (char *)pbVar3;
  return;
}

Assistant:

void ObjFileParser::getComment() {
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}